

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_createSimpleFunctionTypeWithArguments1
          (sysbvm_context_t *context,sysbvm_tuple_t argument,sysbvm_tuple_t resultType)

{
  anon_struct_16_2_94d61efe gcFrame;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  sysbvm_tuple_t local_38 [3];
  
  local_40 = (undefined1 *)&local_68;
  local_68 = 0;
  sStack_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_68 = sysbvm_array_create(context,1);
  if ((local_68 & 0xf) == 0 && local_68 != 0) {
    *(sysbvm_tuple_t *)(local_68 + 0x10) = argument;
  }
  local_38[1] = 0xb;
  local_38[0] = local_68;
  local_38[2] = resultType;
  sStack_60 = sysbvm_function_apply
                        (context,(context->roots).simpleFunctionTypeTemplate,3,local_38,0);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_60;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createSimpleFunctionTypeWithArguments1(sysbvm_context_t *context, sysbvm_tuple_t argument, sysbvm_tuple_t resultType)
{
    struct {
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.arguments = sysbvm_array_create(context, 1);
    sysbvm_array_atPut(gcFrame.arguments, 0, argument);

    gcFrame.result = sysbvm_type_createSimpleFunctionType(context, gcFrame.arguments, 0, resultType);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}